

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O3

void __thiscall libcellml::Variable::removeAllEquivalences(Variable *this)

{
  int iVar1;
  pointer pwVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  _Atomic_word _Var4;
  pointer __pos;
  EntityImpl *pEVar5;
  bool bVar6;
  shared_ptr<libcellml::Variable> thisVariable;
  VariablePtr VStack_38;
  
  std::__shared_ptr<libcellml::Variable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Variable,void>
            ((__shared_ptr<libcellml::Variable,(__gnu_cxx::_Lock_policy)2> *)&VStack_38,
             (__weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libcellml::Variable>);
  pEVar5 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
  __pos = *(pointer *)((long)&pEVar5[2].mId.field_2 + 8);
  pwVar2 = (pointer)pEVar5[3].mId._M_dataplus._M_p;
  if (__pos != pwVar2) {
    do {
      this_00 = (__pos->super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Var4 = this_00->_M_use_count;
        do {
          if (_Var4 == 0) goto LAB_00285733;
          LOCK();
          iVar1 = this_00->_M_use_count;
          bVar6 = _Var4 == iVar1;
          if (bVar6) {
            this_00->_M_use_count = _Var4 + 1;
            iVar1 = _Var4;
          }
          _Var4 = iVar1;
          UNLOCK();
        } while (!bVar6);
        if ((this_00->_M_use_count != 0) &&
           (peVar3 = (__pos->super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr, peVar3 != (element_type *)0x0)) {
          VariableImpl::unsetEquivalentTo
                    ((VariableImpl *)
                     (peVar3->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,&VStack_38
                    );
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
LAB_00285733:
      __pos = __pos + 1;
    } while (__pos != pwVar2);
    pEVar5 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
    __pos = *(pointer *)((long)&pEVar5[2].mId.field_2 + 8);
  }
  std::
  vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>::
  _M_erase_at_end((vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
                   *)((long)&pEVar5[2].mId.field_2 + 8),__pos);
  if (VStack_38.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (VStack_38.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void Variable::removeAllEquivalences()
{
    auto thisVariable = shared_from_this();
    for (const auto &variable : pFunc()->mEquivalentVariables) {
        auto equivalentVariable = variable.lock();
        if (equivalentVariable != nullptr) {
            equivalentVariable->pFunc()->unsetEquivalentTo(thisVariable);
        }
    }
    pFunc()->mEquivalentVariables.clear();
}